

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

float overlap(float x1,float w1,float x2,float w2)

{
  float fVar1;
  float local_30;
  float local_2c;
  float right;
  float r2;
  float r1;
  float left;
  float l2;
  float l1;
  float w2_local;
  float x2_local;
  float w1_local;
  float x1_local;
  
  fVar1 = x1 - w1 / 2.0;
  local_2c = x2 - w2 / 2.0;
  if (local_2c < fVar1) {
    local_2c = fVar1;
  }
  fVar1 = x1 + w1 / 2.0;
  local_30 = x2 + w2 / 2.0;
  if (fVar1 < local_30) {
    local_30 = fVar1;
  }
  return local_30 - local_2c;
}

Assistant:

static float overlap(float x1, float w1, float x2, float w2)
{
    float l1 = x1 - w1/2;
    float l2 = x2 - w2/2;
    float left = l1 > l2 ? l1 : l2;
    float r1 = x1 + w1/2;
    float r2 = x2 + w2/2;
    float right = r1 < r2 ? r1 : r2;
    return right - left;
}